

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O0

Log __thiscall Log::addStringStream<unsigned_int>(Log *this,uint t)

{
  bool bVar1;
  uint uVar2;
  void *__buf;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  Log LVar4;
  string local_1c8 [8];
  string string;
  ostringstream local_198 [8];
  ostringstream str;
  uint t_local;
  Log *this_local;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)CONCAT44(in_register_00000034,t))
  ;
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::ostream::operator<<((ostream *)local_198,in_EDX);
    std::__cxx11::ostringstream::str();
    __buf = (void *)std::__cxx11::string::data();
    uVar2 = std::__cxx11::string::size();
    write(this,t,__buf,(ulong)uVar2);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    Log(this,(Log *)CONCAT44(in_register_00000034,t));
    _Var3._M_pi = extraout_RDX_00;
  }
  LVar4.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  LVar4.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Log)LVar4.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Log addStringStream(T t)
    {
        if (mData) {
            std::ostringstream str;
            str << t;
            const std::string string = str.str();
            return write(string.data(), string.size());
        }
        return *this;
    }